

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O2

double __thiscall
crnlib::vec<2U,_float>::normalize(vec<2U,_float> *this,vec<2U,_float> *pDefaultVec)

{
  double __x;
  double dVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)*(undefined8 *)this->m_s;
  fVar3 = (float)((ulong)*(undefined8 *)this->m_s >> 0x20);
  __x = (double)(fVar3 * fVar3) + (double)(fVar2 * fVar2);
  if ((__x != 0.0) || (NAN(__x))) {
    if (__x < 0.0) {
      dVar1 = sqrt(__x);
    }
    else {
      dVar1 = SQRT(__x);
    }
    operator*=(this,(float)(1.0 / dVar1));
  }
  else if (pDefaultVec != (vec<2U,_float> *)0x0) {
    operator=(this,pDefaultVec);
  }
  return __x;
}

Assistant:

inline double normalize(const vec* pDefaultVec = NULL) {
    double n = m_s[0] * m_s[0];
    for (uint i = 1; i < N; i++)
      n += m_s[i] * m_s[i];

    if (n != 0)
      *this *= static_cast<T>((1.0f / sqrt(n)));
    else if (pDefaultVec)
      *this = *pDefaultVec;
    return n;
  }